

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvd.inc.c
# Opt level: O1

_Bool trans_fsgnjx_d(DisasContext_conflict12 *ctx,arg_fsgnjx_d *a)

{
  TCGContext_conflict11 *s;
  _Bool _Var1;
  TCGTemp *ts;
  
  if (ctx->mstatus_fs != 0) {
    if ((ctx->misa & 8) == 0) {
      _Var1 = false;
    }
    else {
      s = ctx->uc->tcg_ctx;
      if (a->rs1 == a->rs2) {
        tcg_gen_andi_i64_riscv64(s,s->cpu_fpr[a->rd],s->cpu_fpr[a->rs1],0x7fffffffffffffff);
      }
      else {
        ts = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
        tcg_gen_andi_i64_riscv64
                  (s,(TCGv_i64)((long)ts - (long)s),s->cpu_fpr[a->rs2],-0x8000000000000000);
        tcg_gen_op3_riscv64(s,INDEX_op_xor_i64,
                            (TCGArg)((long)&s->pool_cur + (long)s->cpu_fpr[a->rd]),
                            (TCGArg)((long)&s->pool_cur + (long)s->cpu_fpr[a->rs1]),(TCGArg)ts);
        tcg_temp_free_internal_riscv64(s,ts);
      }
      mark_fs_dirty(ctx);
      _Var1 = true;
    }
    return _Var1;
  }
  return false;
}

Assistant:

static bool trans_fsgnjx_d(DisasContext *ctx, arg_fsgnjx_d *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVD);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->rs1 == a->rs2) { /* FABS */
        tcg_gen_andi_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs1], ~INT64_MIN);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_andi_i64(tcg_ctx, t0, tcg_ctx->cpu_fpr[a->rs2], INT64_MIN);
        tcg_gen_xor_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs1], t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
    mark_fs_dirty(ctx);
    return true;
}